

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::MessageOptions::SharedCtor(MessageOptions *this)

{
  this->_cached_size_ = 0;
  this->message_set_wire_format_ = false;
  this->no_standard_descriptor_accessor_ = false;
  this->deprecated_ = false;
  this->map_entry_ = false;
  return;
}

Assistant:

void MessageOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&message_set_wire_format_, 0, reinterpret_cast<char*>(&map_entry_) -
    reinterpret_cast<char*>(&message_set_wire_format_) + sizeof(map_entry_));
}